

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>::
MatchExpr(MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>
          *this,duckdb_interval *arg,PredicateMatcher<duckdb_interval> *matcher,
         StringRef *matcherString)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 *in_RCX;
  PredicateMatcher<duckdb_interval> *in_RDX;
  PredicateMatcher<duckdb_interval> *in_RSI;
  ITransientExpression *in_RDI;
  
  iVar2 = (*(in_RDX->super_MatcherBase<duckdb_interval>).super_MatcherUntypedBase.
            _vptr_MatcherUntypedBase[3])(in_RDX,in_RSI);
  ITransientExpression::ITransientExpression(in_RDI,true,SUB41(iVar2,0));
  in_RDI->_vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00a16b50;
  in_RDI[1]._vptr_ITransientExpression = (_func_int **)in_RSI;
  Matchers::Generic::PredicateMatcher<duckdb_interval>::PredicateMatcher(in_RSI,in_RDX);
  uVar1 = *in_RCX;
  in_RDI[8].m_isBinaryExpression = (bool)(char)uVar1;
  in_RDI[8].m_result = (bool)(char)((ulong)uVar1 >> 8);
  *(int6 *)&in_RDI[8].field_0xa = (int6)((ulong)uVar1 >> 0x10);
  in_RDI[9]._vptr_ITransientExpression = (_func_int **)in_RCX[1];
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}